

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSpeedup.c
# Opt level: O2

int Abc_NtkSpeedupNode_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vNodes)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pNode);
  if (iVar1 == 0) {
    uVar2 = *(uint *)&pNode->field_0x14 & 0xf;
    if (uVar2 == 2) {
      return 0;
    }
    if (uVar2 == 5) {
      return 0;
    }
    if (uVar2 != 7) {
      __assert_fail("Abc_ObjIsNode(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcSpeedup.c"
                    ,0x163,"int Abc_NtkSpeedupNode_rec(Abc_Obj_t *, Vec_Ptr_t *)");
    }
    Abc_NodeSetTravIdCurrent(pNode);
    iVar1 = Abc_NtkSpeedupNode_rec
                      ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray],vNodes);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = Abc_NtkSpeedupNode_rec
                      ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]],vNodes);
    if (iVar1 == 0) {
      return 0;
    }
    Vec_PtrPush(vNodes,pNode);
  }
  return 1;
}

Assistant:

int Abc_NtkSpeedupNode_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vNodes )
{
    if ( Abc_NodeIsTravIdCurrent(pNode) )
        return 1;
    if ( Abc_ObjIsCi(pNode) )
        return 0;
    assert( Abc_ObjIsNode(pNode) );
    Abc_NodeSetTravIdCurrent( pNode );
    if ( !Abc_NtkSpeedupNode_rec( Abc_ObjFanin0(pNode), vNodes ) )
        return 0;
    if ( !Abc_NtkSpeedupNode_rec( Abc_ObjFanin1(pNode), vNodes ) )
        return 0;
    Vec_PtrPush( vNodes, pNode );
    return 1;
}